

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void keep_least_weights(vector<double,_std::allocator<double>_> *old_weights,
                       vector<double,_std::allocator<double>_> *new_weights)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  uint uVar5;
  ulong uVar6;
  
  pdVar2 = (old_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (old_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (new_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < (ulong)((long)pdVar3 - (long)pdVar2 >> 3);
      uVar5 = uVar5 + 1) {
    dVar1 = pdVar4[uVar6];
    if (dVar1 < pdVar2[uVar6]) {
      pdVar2[uVar6] = dVar1;
    }
  }
  return;
}

Assistant:

void keep_least_weights(std::vector<double>& old_weights, const std::vector<double>& new_weights){
    // std::cout<<" dbg size comparison: "<<old_weights.size()<<" vs "<<new_weights.size()<<'\n';
    // std::cout<<" dbg new weights: ";
    for(unsigned i=0;i<old_weights.size();++i){
        // std::cout<<" \ndbg check if "<<old_weights[i]<<" > "<<new_weights[i]<<" ? => ";
        if(old_weights[i]>new_weights[i]){
            old_weights[i]=new_weights[i];
        }
        // std::cout<<old_weights[i]<<" ";
    }
    // std::cout<<'\n';
}